

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O2

void __thiscall t_cl_generator::generate_enum(t_cl_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  pointer pptVar5;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_88;
  _Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_68;
  string local_50;
  t_cl_generator *this_00;
  
  poVar1 = &this->f_types_;
  poVar4 = std::operator<<((ostream *)poVar1,"(thrift:def-enum ");
  iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  this_00 = (t_cl_generator *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::string((string *)&local_50,(string *)this_00);
  prefix(&local_88,this_00,&local_50);
  poVar4 = std::operator<<(poVar4,(string *)&local_88);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_68,&tenum->constants_
            );
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_88);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string((string *)&local_88);
  for (pptVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
      pptVar5 != local_68._M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    iVar3 = (*pptVar5)->value_;
    if (pptVar5 != local_68._M_impl.super__Vector_impl_data._M_start) {
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_88);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)&local_88);
    }
    poVar4 = std::operator<<((ostream *)poVar1,"(\"");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    poVar4 = std::operator<<(poVar4,"\" . ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::operator<<(poVar4,")");
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar4 = std::operator<<((ostream *)poVar1,"))");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void t_cl_generator::generate_enum(t_enum* tenum) {
  f_types_ << "(thrift:def-enum " << prefix(tenum->get_name()) << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  int value = -1;

  indent_up();
  f_types_ << indent() << "(";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    value = (*c_iter)->get_value();

    if(c_iter != constants.begin()) f_types_ << endl << indent() << " ";

    f_types_ << "(\"" << (*c_iter)->get_name() << "\" . " << value << ")";
  }
  indent_down();
  f_types_ << "))" << endl << endl;
}